

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

StringPtr kj::operator*(undefined4 param_1)

{
  bool bVar1;
  Fault local_68;
  Fault f;
  uint *local_58;
  undefined1 local_50 [8];
  DebugComparison<unsigned_int_&,_unsigned_long> _kjCondition;
  uint index;
  HttpMethod method_local;
  
  _kjCondition._36_4_ = param_1;
  local_58 = (uint *)_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&_::MAGIC_ASSERT,
                                (uint *)&_kjCondition.field_0x24);
  f.exception = (Exception *)size<char_const*,26ul>((char *(*) [26])METHOD_NAMES);
  _::DebugExpression<unsigned_int&>::operator<
            ((DebugComparison<unsigned_int_&,_unsigned_long> *)local_50,
             (DebugExpression<unsigned_int&> *)&local_58,(unsigned_long *)&f);
  bVar1 = _::DebugComparison::operator_cast_to_bool((DebugComparison *)local_50);
  if (!bVar1) {
    _::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_long>&,char_const(&)[20]>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x155,FAILED,"index < size(METHOD_NAMES)","_kjCondition,\"invalid HTTP method\"",
               (DebugComparison<unsigned_int_&,_unsigned_long> *)local_50,
               (char (*) [20])"invalid HTTP method");
    _::Debug::Fault::fatal(&local_68);
  }
  StringPtr::StringPtr
            ((StringPtr *)&method_local,
             *(char **)(METHOD_NAMES + (ulong)(uint)_kjCondition._36_4_ * 8));
  return (StringPtr)_method_local;
}

Assistant:

kj::StringPtr KJ_STRINGIFY(HttpMethod method) {
  auto index = static_cast<uint>(method);
  KJ_ASSERT(index < size(METHOD_NAMES), "invalid HTTP method");

  return METHOD_NAMES[index];
}